

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O1

bool Am_Object_And_Owners_Valid_And_Visible(Am_Object *obj)

{
  bool bVar1;
  bool bVar2;
  Am_Value *this;
  Am_Object local_40;
  Am_Object local_38;
  
  bVar1 = Am_Object::Valid(obj);
  if (bVar1) {
    do {
      this = Am_Object::Get(obj,0x69,4);
      bVar1 = Am_Value::operator_cast_to_bool(this);
      if (!bVar1) {
        return false;
      }
      bVar2 = Am_Object::operator==(obj,&Am_Screen);
      bVar1 = true;
      if (!bVar2) {
        Am_Object::Get_Prototype(&local_38);
        bVar1 = Am_Object::operator==(&local_38,&Am_Screen);
        Am_Object::~Am_Object(&local_38);
      }
      if (bVar1 != false) {
        return true;
      }
      Am_Object::Get_Object(&local_40,(Am_Slot_Key)obj,10);
      Am_Object::operator=(obj,&local_40);
      Am_Object::~Am_Object(&local_40);
      bVar1 = Am_Object::Valid(obj);
    } while (bVar1);
  }
  return false;
}

Assistant:

bool
Am_Object_And_Owners_Valid_And_Visible(Am_Object obj)
{
  while (true) {
    if (!obj.Valid())
      return false;
    if (!(bool)obj.Get(Am_VISIBLE, Am_NO_DEPENDENCY))
      return false;
    if (obj == Am_Screen || obj.Get_Prototype() == Am_Screen)
      return true;
    obj = obj.Get_Owner(Am_NO_DEPENDENCY);
  }
}